

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::sc_signal_t
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this,void **vtt,char *name_,
          sc_logic *initial_value_)

{
  sc_signal_inout_if<sc_dt::sc_logic> *in_RCX;
  sc_signal_channel *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffb8;
  void **in_stack_ffffffffffffffd8;
  
  sc_signal_inout_if<sc_dt::sc_logic>::sc_signal_inout_if(in_RCX,in_stack_ffffffffffffffd8);
  sc_signal_channel::sc_signal_channel(in_RSI,in_stack_ffffffffffffffb8);
  sc_writer_policy_check<(sc_core::sc_writer_policy)1>::sc_writer_policy_check
            ((sc_writer_policy_check<(sc_core::sc_writer_policy)1> *)0x2349ab);
  *in_RDI = (long)(in_RSI->super_sc_prim_channel).super_sc_object._vptr_sc_object;
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x30)) =
       *(undefined8 *)&(in_RSI->super_sc_prim_channel).super_sc_object.m_name;
  in_RDI[1] = *(long *)&(in_RSI->super_sc_prim_channel).super_sc_object.field_0x48;
  in_RDI[2] = (long)&PTR_print_0035f758;
  sc_dt::sc_logic::sc_logic((sc_logic *)(in_RDI + 0x16),(sc_logic *)in_RCX);
  sc_dt::sc_logic::sc_logic((sc_logic *)((long)in_RDI + 0xb4),(sc_logic *)in_RCX);
  return;
}

Assistant:

sc_signal_t( const char* name_, const T& initial_value_ )
      : base_type( name_ )
      , m_cur_val( initial_value_ )
      , m_new_val( initial_value_ )
    {}